

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderInvarianceTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::anon_unknown_1::InvarianceTest::init
          (InvarianceTest *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  float *pfVar2;
  deUint32 *this_00;
  pointer *this_01;
  undefined4 *puVar3;
  RenderContext *pRVar4;
  int iVar5;
  deUint32 err;
  int extraout_EAX;
  RenderTarget *pRVar6;
  ShaderProgram *pSVar7;
  ProgramSources *pPVar8;
  TestLog *pTVar9;
  undefined4 extraout_var;
  NotSupportedError *this_02;
  TestError *pTVar11;
  long lVar12;
  Vec4 vertex2;
  Vec4 vertex3;
  ShaderPair vertexShaders;
  string local_360;
  anon_unknown_1 local_340 [16];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> triangles;
  Random rnd;
  long lVar10;
  
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (this->m_renderSize <= pRVar6->m_width) {
    pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (this->m_renderSize <= pRVar6->m_height) {
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&vertexShaders);
      pSVar7 = (ShaderProgram *)operator_new(0xd0);
      pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
      memset(&triangles,0,0xac);
      glu::VertexSource::VertexSource((VertexSource *)&rnd,&vertexShaders.vertexShaderSource0);
      pPVar8 = glu::ProgramSources::operator<<((ProgramSources *)&triangles,(ShaderSource *)&rnd);
      glu::FragmentSource::FragmentSource
                ((FragmentSource *)&vertex2,&vertexShaders.fragmentShaderSource0);
      pPVar8 = glu::ProgramSources::operator<<(pPVar8,(ShaderSource *)&vertex2);
      glu::ShaderProgram::ShaderProgram(pSVar7,pRVar4,pPVar8);
      this->m_shader0 = pSVar7;
      std::__cxx11::string::~string((string *)(vertex2.m_data + 2));
      std::__cxx11::string::~string((string *)&rnd.m_rnd.z);
      glu::ProgramSources::~ProgramSources((ProgramSources *)&triangles);
      if ((this->m_shader0->m_program).m_info.linkOk == false) {
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        this->m_shader0);
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&triangles,"Test shader compile failed.",(allocator<char> *)&rnd);
        tcu::TestError::TestError(pTVar11,(string *)&triangles);
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      pSVar7 = (ShaderProgram *)operator_new(0xd0);
      pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
      memset(&triangles,0,0xac);
      glu::VertexSource::VertexSource((VertexSource *)&rnd,&vertexShaders.vertexShaderSource1);
      pPVar8 = glu::ProgramSources::operator<<((ProgramSources *)&triangles,(ShaderSource *)&rnd);
      glu::FragmentSource::FragmentSource
                ((FragmentSource *)&vertex2,&vertexShaders.fragmentShaderSource1);
      pPVar8 = glu::ProgramSources::operator<<(pPVar8,(ShaderSource *)&vertex2);
      glu::ShaderProgram::ShaderProgram(pSVar7,pRVar4,pPVar8);
      this->m_shader1 = pSVar7;
      std::__cxx11::string::~string((string *)(vertex2.m_data + 2));
      std::__cxx11::string::~string((string *)&rnd.m_rnd.z);
      glu::ProgramSources::~ProgramSources((ProgramSources *)&triangles);
      if ((this->m_shader1->m_program).m_info.linkOk != false) {
        rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = &rnd.m_rnd.z;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,"Shader 1:");
        pTVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
        triangles.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)glu::operator<<(pTVar9,this->m_shader0)
        ;
        this_01 = &triangles.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
        std::operator<<((ostream *)this_01,"Shader 2:");
        pTVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&triangles,
                            (EndMessageToken *)&tcu::TestLog::EndMessage);
        glu::operator<<(pTVar9,this->m_shader1);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        ShaderPair::~ShaderPair(&vertexShaders);
        deRandom_init(&rnd.m_rnd,0x7b);
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  (&triangles,0x1b0,(allocator_type *)&vertexShaders);
        iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        lVar10 = CONCAT44(extraout_var,iVar5);
        for (lVar12 = 0; lVar12 != 0xd80; lVar12 = lVar12 + 0x30) {
          genRandomVector((anon_unknown_1 *)&vertexShaders,&rnd);
          genRandomVector((anon_unknown_1 *)&vertex2,&rnd);
          genRandomVector(local_340,&rnd);
          tcu::operator*((tcu *)&local_360,0.01,(Vector<float,_4> *)local_340);
          tcu::operator+((tcu *)&vertex3,(Vector<float,_4> *)&vertex2,(Vector<float,_4> *)&local_360
                        );
          puVar1 = (undefined8 *)
                   ((long)(triangles.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
          *puVar1 = CONCAT44(vertexShaders.vertexShaderSource0._M_dataplus._M_p._4_4_,
                             vertexShaders.vertexShaderSource0._M_dataplus._M_p._0_4_);
          puVar1[1] = CONCAT44(vertexShaders.vertexShaderSource0._M_string_length._4_4_,
                               (undefined4)vertexShaders.vertexShaderSource0._M_string_length);
          pfVar2 = (float *)((long)triangles.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar12);
          *(undefined8 *)pfVar2 = vertex2.m_data._0_8_;
          *(undefined8 *)(pfVar2 + 2) = vertex2.m_data._8_8_;
          pfVar2 = (float *)((long)triangles.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar12);
          *pfVar2 = vertex3.m_data[0];
          pfVar2[1] = vertex3.m_data[1];
          pfVar2[2] = vertex3.m_data[2];
          pfVar2[3] = vertex3.m_data[3];
        }
        for (lVar12 = 0; lVar12 != 0xd80; lVar12 = lVar12 + 0x30) {
          genRandomVector((anon_unknown_1 *)&vertexShaders,&rnd);
          puVar1 = (undefined8 *)
                   ((long)triangles.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xd8].m_data + lVar12);
          *puVar1 = CONCAT44(vertexShaders.vertexShaderSource0._M_dataplus._M_p._4_4_,
                             vertexShaders.vertexShaderSource0._M_dataplus._M_p._0_4_);
          puVar1[1] = CONCAT44(vertexShaders.vertexShaderSource0._M_string_length._4_4_,
                               (undefined4)vertexShaders.vertexShaderSource0._M_string_length);
          genRandomVector((anon_unknown_1 *)&vertexShaders,&rnd);
          puVar1 = (undefined8 *)
                   ((long)triangles.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xd9].m_data + lVar12);
          *puVar1 = CONCAT44(vertexShaders.vertexShaderSource0._M_dataplus._M_p._4_4_,
                             vertexShaders.vertexShaderSource0._M_dataplus._M_p._0_4_);
          puVar1[1] = CONCAT44(vertexShaders.vertexShaderSource0._M_string_length._4_4_,
                               (undefined4)vertexShaders.vertexShaderSource0._M_string_length);
          genRandomVector((anon_unknown_1 *)&vertexShaders,&rnd);
          puVar3 = (undefined4 *)
                   ((long)triangles.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xda].m_data + lVar12);
          *puVar3 = vertexShaders.vertexShaderSource0._M_dataplus._M_p._0_4_;
          puVar3[1] = vertexShaders.vertexShaderSource0._M_dataplus._M_p._4_4_;
          puVar3[2] = (undefined4)vertexShaders.vertexShaderSource0._M_string_length;
          puVar3[3] = vertexShaders.vertexShaderSource0._M_string_length._4_4_;
        }
        (**(code **)(lVar10 + 0x6c8))(1,&this->m_arrayBuf);
        (**(code **)(lVar10 + 0x40))(0x8892,this->m_arrayBuf);
        (**(code **)(lVar10 + 0x150))
                  (0x8892,(long)((int)triangles.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (int)triangles.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0
                   ,triangles.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,0x88e4);
        err = (**(code **)(lVar10 + 0x800))();
        glu::checkError(err,"buffer gen",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderInvarianceTests.cpp"
                        ,0xeb);
        this->m_verticesInPattern = 0xd8;
        std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
        ~_Vector_base(&triangles.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     );
        return extraout_EAX;
      }
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      this->m_shader1);
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&triangles,"Test shader compile failed.",(allocator<char> *)&rnd);
      tcu::TestError::TestError(pTVar11,(string *)&triangles);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertex2,"Render target size must be at least ",(allocator<char> *)local_340)
  ;
  de::toString<int>((string *)&vertex3,&this->m_renderSize);
  std::operator+(&vertexShaders.vertexShaderSource0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vertex2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vertex3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                 &vertexShaders.vertexShaderSource0,"x");
  de::toString<int>(&local_360,&this->m_renderSize);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&triangles,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                 &local_360);
  tcu::NotSupportedError::NotSupportedError(this_02,(string *)&triangles);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InvarianceTest::init (void)
{
	// Invariance tests require drawing to the screen and reading back results.
	// Tests results are not reliable if the resolution is too small
	{
		if (m_context.getRenderTarget().getWidth()  < m_renderSize ||
			m_context.getRenderTarget().getHeight() < m_renderSize)
			throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(m_renderSize) + "x" + de::toString(m_renderSize));
	}

	// Gen shaders
	{
		ShaderPair vertexShaders = genShaders();

		m_shader0 = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexShaders.vertexShaderSource0) << glu::FragmentSource(vertexShaders.fragmentShaderSource0));
		if (!m_shader0->isOk())
		{
			m_testCtx.getLog() << *m_shader0;
			throw tcu::TestError("Test shader compile failed.");
		}

		m_shader1 = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexShaders.vertexShaderSource1) << glu::FragmentSource(vertexShaders.fragmentShaderSource1));
		if (!m_shader1->isOk())
		{
			m_testCtx.getLog() << *m_shader1;
			throw tcu::TestError("Test shader compile failed.");
		}

		// log
		m_testCtx.getLog()
			<< tcu::TestLog::Message << "Shader 1:" << tcu::TestLog::EndMessage
			<< *m_shader0
			<< tcu::TestLog::Message << "Shader 2:" << tcu::TestLog::EndMessage
			<< *m_shader1;
	}

	// Gen test pattern
	{
		const int				numTriangles	= 72;
		de::Random				rnd				(123);
		std::vector<tcu::Vec4>	triangles		(numTriangles * 3 * 2);
		const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();

		// Narrow triangle pattern
		for (int triNdx = 0; triNdx < numTriangles; ++triNdx)
		{
			const tcu::Vec4 vertex1 = genRandomVector(rnd);
			const tcu::Vec4 vertex2 = genRandomVector(rnd);
			const tcu::Vec4 vertex3 = vertex2 + genRandomVector(rnd) * 0.01f; // generate narrow triangles

			triangles[triNdx*3 + 0] = vertex1;
			triangles[triNdx*3 + 1] = vertex2;
			triangles[triNdx*3 + 2] = vertex3;
		}

		// Normal triangle pattern
		for (int triNdx = 0; triNdx < numTriangles; ++triNdx)
		{
			triangles[(numTriangles + triNdx)*3 + 0] = genRandomVector(rnd);
			triangles[(numTriangles + triNdx)*3 + 1] = genRandomVector(rnd);
			triangles[(numTriangles + triNdx)*3 + 2] = genRandomVector(rnd);
		}

		// upload
		gl.genBuffers(1, &m_arrayBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_arrayBuf);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(triangles.size() * sizeof(tcu::Vec4)), &triangles[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "buffer gen");

		m_verticesInPattern = numTriangles * 3;
	}
}